

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

Abc_Obj_t * Io_BlifParseConstruct_rec(Io_BlifMan_t *p,char *pName)

{
  Io_BlifObj_t *pIVar1;
  uint uVar2;
  int iVar3;
  Io_BlifObj_t **ppIVar4;
  Vec_Ptr_t *vTokens;
  char *pcVar5;
  size_t sVar6;
  Abc_Obj_t *pAVar7;
  int local_44;
  int i;
  char *pNameFanin;
  Io_BlifObj_t *pObjIo;
  Abc_Obj_t *pFaninAbc;
  Vec_Ptr_t *vFanins;
  char *pName_local;
  Io_BlifMan_t *p_local;
  
  ppIVar4 = Io_BlifHashLookup(p,pName);
  pIVar1 = *ppIVar4;
  if (pIVar1 == (Io_BlifObj_t *)0x0) {
    uVar2 = Io_BlifGetLine(p,pName);
    sprintf(p->sError,"Line %d: Signal (%s) is not defined as a table.",(ulong)uVar2,pName);
    p_local = (Io_BlifMan_t *)0x0;
  }
  else if ((*(uint *)pIVar1 >> 5 & 1) == 0) {
    if (pIVar1->pEquiv == (void *)0x0) {
      *(uint *)pIVar1 = *(uint *)pIVar1 & 0xffffffdf | 0x20;
      vTokens = Vec_PtrAlloc(8);
      Io_BlifCollectTokens(vTokens,pIVar1->pName + -(long)(int)(*(uint *)pIVar1 >> 8),pIVar1->pName)
      ;
      for (local_44 = 0; iVar3 = Vec_PtrSize(vTokens), local_44 < iVar3; local_44 = local_44 + 1) {
        pcVar5 = (char *)Vec_PtrEntry(vTokens,local_44);
        pAVar7 = Io_BlifParseConstruct_rec(p,pcVar5);
        if (pAVar7 == (Abc_Obj_t *)0x0) {
          Vec_PtrFree(vTokens);
          return (Abc_Obj_t *)0x0;
        }
        Vec_PtrWriteEntry(vTokens,local_44,pAVar7);
      }
      pcVar5 = pIVar1->pName;
      sVar6 = strlen(pIVar1->pName);
      pAVar7 = Io_BlifParseTable(p,pcVar5 + sVar6,vTokens);
      pIVar1->pEquiv = pAVar7;
      Vec_PtrFree(vTokens);
      *(uint *)pIVar1 = *(uint *)pIVar1 & 0xffffffdf;
      p_local = (Io_BlifMan_t *)pIVar1->pEquiv;
    }
    else {
      p_local = (Io_BlifMan_t *)pIVar1->pEquiv;
    }
  }
  else {
    uVar2 = Io_BlifGetLine(p,pName);
    sprintf(p->sError,"Line %d: Signal (%s) appears twice on a combinational path.",(ulong)uVar2,
            pName);
    p_local = (Io_BlifMan_t *)0x0;
  }
  return (Abc_Obj_t *)p_local;
}

Assistant:

static Abc_Obj_t * Io_BlifParseConstruct_rec( Io_BlifMan_t * p, char * pName )
{
    Vec_Ptr_t * vFanins;
    Abc_Obj_t * pFaninAbc;
    Io_BlifObj_t * pObjIo;
    char * pNameFanin;
    int i;
    // get the IO object with this name
    pObjIo = *Io_BlifHashLookup( p, pName );
    if ( pObjIo == NULL )
    {
        sprintf( p->sError, "Line %d: Signal (%s) is not defined as a table.", Io_BlifGetLine(p, pName), pName );
        return NULL;
    }
    // loop detection
    if ( pObjIo->fLoop )
    {
        sprintf( p->sError, "Line %d: Signal (%s) appears twice on a combinational path.", Io_BlifGetLine(p, pName), pName );
        return NULL;
    }
    // check if the AIG is already constructed
    if ( pObjIo->pEquiv )
        return (Abc_Obj_t *)pObjIo->pEquiv;
    // mark this node on the path
    pObjIo->fLoop = 1;
    // construct the AIGs for the fanins
    vFanins = Vec_PtrAlloc( 8 );
    Io_BlifCollectTokens( vFanins, pObjIo->pName - pObjIo->Offset, pObjIo->pName );
    Vec_PtrForEachEntry( char *, vFanins, pNameFanin, i )
    {
        pFaninAbc = Io_BlifParseConstruct_rec( p, pNameFanin );
        if ( pFaninAbc == NULL )
        {
            Vec_PtrFree( vFanins );
            return NULL;
        }
        Vec_PtrWriteEntry( vFanins, i, pFaninAbc );
    }
    // construct the node
    pObjIo->pEquiv = Io_BlifParseTable( p, pObjIo->pName + strlen(pObjIo->pName), vFanins );
    Vec_PtrFree( vFanins );
    // unmark this node on the path
    pObjIo->fLoop = 0;
    // remember the new node
    return (Abc_Obj_t *)pObjIo->pEquiv;
}